

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O2

void testTiledYa(string *tempDir)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  char *in_RCX;
  int iVar5;
  _func_void_Array2D<Imf_3_4::Rgba>_ptr_int_int *in_R8;
  string fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Box2i local_48;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing tiled luminance input and output");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator+(&local_68,tempDir,"imf_test_tiled_ya.exr");
  bVar1 = IlmThread_3_4::supportsThreads();
  for (iVar5 = 0; (uint)bVar1 + (uint)bVar1 * 2 + 1 != iVar5; iVar5 = iVar5 + 1) {
    cVar2 = IlmThread_3_4::supportsThreads();
    if (cVar2 != '\0') {
      Imf_3_4::setGlobalThreadCount(iVar5);
      poVar4 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      iVar3 = Imf_3_4::globalThreadCount();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    local_48.min.x = -0x11;
    local_48.min.y = -0x1d;
    local_48.max.x = 0x15c;
    local_48.max.y = 0x22c;
    anon_unknown.dwarf_2ca381::writeReadYa
              (&local_48,(int)local_68._M_dataplus._M_p,0x194a99,in_RCX,in_R8);
    anon_unknown.dwarf_2ca381::writeReadYa
              (&local_48,(int)local_68._M_dataplus._M_p,0x194c1e,in_RCX,in_R8);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void
testTiledYa (const std::string& tempDir)
{
    try
    {
        cout << "Testing tiled luminance input and output" << endl;

        std::string fileName = tempDir + "imf_test_tiled_ya.exr";

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            Box2i dataWindow (V2i (-17, -29), V2i (348, 556));
            writeReadYa (dataWindow, 19, 27, fileName.c_str (), waves);
            writeReadYa (dataWindow, 19, 27, fileName.c_str (), wheel);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}